

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connector.cpp
# Opt level: O1

bool __thiscall
helics::apps::Connector::makePotentialTemplateConnection
          (Connector *this,string_view interface,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *tagList,
          vector<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_>
          *potentialTemplates,
          unordered_multimap<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
          *aliases)

{
  pointer pTVar1;
  _Base_ptr p_Var2;
  pointer pTVar3;
  pointer pCVar4;
  bool bVar5;
  string_view target;
  vector<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_> *__range4;
  optional<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
  match;
  set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  aliasList;
  vector<helics::apps::Connection,_std::allocator<helics::apps::Connection>_> connectionOptions;
  bool local_13d;
  int local_13c;
  _Storage<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_true>
  local_120;
  char local_f0;
  basic_string_view<char,_std::char_traits<char>_> local_e8;
  basic_string_view<char,_std::char_traits<char>_> local_d8;
  basic_string_view<char,_std::char_traits<char>_> local_c8;
  _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_b0;
  vector<helics::apps::Connection,_std::allocator<helics::apps::Connection>_> local_80;
  basic_string_view<char,_std::char_traits<char>_> local_68;
  basic_string_view<char,_std::char_traits<char>_> local_58;
  basic_string_view<char,_std::char_traits<char>_> local_48;
  
  buildPossibleConnectionList(&local_80,this,interface,tagList);
  local_13d = local_80.
              super__Vector_base<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              local_80.
              super__Vector_base<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if (local_13d) {
    pCVar4 = local_80.
             super__Vector_base<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      pTVar1 = (potentialTemplates->
               super__Vector_base<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      for (pTVar3 = (potentialTemplates->
                    super__Vector_base<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_>
                    )._M_impl.super__Vector_impl_data._M_start; pTVar3 != pTVar1;
          pTVar3 = pTVar3 + 1) {
        TemplateMatcher::isTemplateMatch
                  ((optional<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    *)&local_120._M_value,pTVar3,pCVar4->interface2);
        if (local_f0 == '\x01') {
          local_48._M_len =
               local_120._M_value.
               super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
               .super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>.
               _M_head_impl._M_len;
          local_48._M_str =
               local_120._M_value.
               super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
               .super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>.
               _M_head_impl._M_str;
          local_58._M_len =
               local_120._M_value.
               super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
               .
               super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
               .super__Head_base<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>.
               _M_head_impl._M_len;
          local_58._M_str =
               local_120._M_value.
               super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
               .
               super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
               .super__Head_base<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>.
               _M_head_impl._M_str;
          local_68._M_len =
               local_120._M_value.
               super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
               .
               super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
               .super__Tuple_impl<2UL,_std::basic_string_view<char,_std::char_traits<char>_>_>.
               super__Head_base<2UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>.
               _M_head_impl._M_len;
          local_68._M_str =
               local_120._M_value.
               super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
               .
               super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
               .super__Tuple_impl<2UL,_std::basic_string_view<char,_std::char_traits<char>_>_>.
               super__Head_base<2UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>.
               _M_head_impl._M_str;
          std::
          vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
          ::
          emplace_back<std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&>
                    ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                      *)&pTVar3->usedTemplates,&local_48,&local_58,&local_68);
          goto LAB_002a01a2;
        }
      }
      target._M_str = (char *)aliases;
      target._M_len = (size_t)(pCVar4->interface2)._M_str;
      generateAliases((set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                       *)&local_b0,(apps *)(pCVar4->interface2)._M_len,target,
                      (unordered_multimap<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                       *)tagList);
      for (p_Var2 = local_b0._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var2 != &local_b0._M_impl.super__Rb_tree_header;
          p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
        pTVar3 = (potentialTemplates->
                 super__Vector_base<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        pTVar1 = (potentialTemplates->
                 super__Vector_base<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        local_13c = 0;
        for (; bVar5 = pTVar3 != pTVar1, bVar5; pTVar3 = pTVar3 + 1) {
          TemplateMatcher::isTemplateMatch
                    ((optional<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
                      *)&local_120._M_value,pTVar3,*(string_view *)(p_Var2 + 1));
          if (local_f0 == '\x01') {
            local_c8._M_len =
                 local_120._M_value.
                 super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                 .
                 super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>
                 ._M_head_impl._M_len;
            local_c8._M_str =
                 local_120._M_value.
                 super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                 .
                 super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>
                 ._M_head_impl._M_str;
            local_d8._M_len =
                 local_120._M_value.
                 super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                 .
                 super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                 .
                 super__Head_base<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>
                 ._M_head_impl._M_len;
            local_d8._M_str =
                 local_120._M_value.
                 super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                 .
                 super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                 .
                 super__Head_base<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>
                 ._M_head_impl._M_str;
            local_e8._M_len =
                 local_120._M_value.
                 super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                 .
                 super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                 .super__Tuple_impl<2UL,_std::basic_string_view<char,_std::char_traits<char>_>_>.
                 super__Head_base<2UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>
                 ._M_head_impl._M_len;
            local_e8._M_str =
                 local_120._M_value.
                 super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                 .
                 super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                 .super__Tuple_impl<2UL,_std::basic_string_view<char,_std::char_traits<char>_>_>.
                 super__Head_base<2UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>
                 ._M_head_impl._M_str;
            std::
            vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
            ::
            emplace_back<std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&>
                      ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                        *)&pTVar3->usedTemplates,&local_c8,&local_d8,&local_e8);
            local_13c = 1;
            break;
          }
        }
        if (bVar5) goto LAB_002a0134;
      }
      local_13c = 6;
LAB_002a0134:
      std::
      _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ::~_Rb_tree(&local_b0);
      if ((local_13c != 6) && (local_13c != 0)) break;
      pCVar4 = pCVar4 + 1;
      local_13d = pCVar4 != local_80.
                            super__Vector_base<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
    } while (local_13d);
  }
LAB_002a01a2:
  CLI::std::vector<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>::~vector
            (&local_80);
  return local_13d;
}

Assistant:

bool Connector::makePotentialTemplateConnection(
    std::string_view interface,
    const std::vector<std::size_t>& tagList,
    std::vector<TemplateMatcher>& potentialTemplates,
    const std::unordered_multimap<std::string_view, std::string_view>& aliases)
{
    auto connectionOptions = buildPossibleConnectionList(interface, tagList);
    for (const auto& option : connectionOptions) {
        for (auto& matcher : potentialTemplates) {
            auto match = matcher.isTemplateMatch(option.interface2);
            if (match) {
                matcher.setAsUsed(*match);
                return true;
            }
        }
        auto aliasList = generateAliases(option.interface2, aliases);
        for (const auto& alias : aliasList) {
            for (auto& matcher : potentialTemplates) {
                auto match = matcher.isTemplateMatch(alias);
                if (match) {
                    matcher.setAsUsed(*match);
                    return true;
                }
            }
        }
    }
    return false;
}